

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

void __thiscall helics::Federate::registerConnectorInterfacesToml(Federate *this,string *tomlString)

{
  pointer pbVar1;
  Core *pCVar2;
  basic_value<toml::type_config> *pbVar3;
  pointer pcVar4;
  size_type sVar5;
  element_type *peVar6;
  _Hash_node_base _Var7;
  _Hash_node_base *p_Var8;
  bool bVar9;
  string_view inputType_00;
  string_view endpointType;
  string_view outputType_00;
  string_view units;
  string_view filterType;
  string_view translatorType;
  undefined1 auVar10 [8];
  undefined8 uVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  FilterTypes opType;
  int iVar17;
  TranslatorTypes ttype;
  value_type *pvVar18;
  array_type *paVar19;
  enable_if_t<detail::is_exact_toml_type<bool,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<bool>_&>
  pbVar20;
  anon_class_8_1_552cbcb6 callback;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *peVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  string_type *psVar23;
  enable_if_t<detail::is_exact_toml_type<basic_string<char>,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<basic_string<char,_char_traits<char>,_allocator<char>_>_>_&>
  pbVar24;
  anon_class_8_1_a8116966 callback_00;
  floating_type *pfVar25;
  table_type *ptVar26;
  HelicsException *pHVar27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  value *element;
  value *element_00;
  value *element_01;
  value *element_02;
  value *element_03;
  value *element_04;
  value *element_05;
  value *element_06;
  value *element_07;
  value *element_08;
  basic_value<toml::type_config> *target;
  pointer pbVar29;
  __node_base *p_Var30;
  basic_value<toml::type_config> *pbVar31;
  EVP_PKEY_CTX *pEVar32;
  code *pcVar33;
  string *psVar34;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *tagAction;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar35;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  pointer pbVar36;
  basic_value<toml::type_config> *val;
  string_view endpoint;
  string_view endpoint_00;
  string_view endpoint_01;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view name;
  string_view message_06;
  string_view message_07;
  string_view fmt;
  string_view message_08;
  string_view name_00;
  string_view message_09;
  string_view message_10;
  string_view message_11;
  string_view message_12;
  string_view fmt_00;
  string_view message_13;
  string_view message_14;
  string_view message_15;
  format_args args;
  format_args args_00;
  bool defaultGlobal;
  value uval;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> targets;
  string inputType;
  string operation;
  string outputType;
  string key;
  string info;
  value doc;
  _Alloc_hider in_stack_fffffffffffff8e0;
  char *in_stack_fffffffffffff8e8;
  undefined1 local_708 [16];
  undefined1 local_6f8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  bool local_6c1;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  undefined1 local_698 [16];
  undefined1 local_688 [56];
  region local_650;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  undefined1 local_5a8 [16];
  undefined1 local_598 [56];
  region local_560;
  undefined1 auStack_4f8 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  pointer local_3f0;
  pointer local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  char *local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_2b0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_2a0;
  EVP_PKEY_CTX *local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_290;
  basic_value<toml::type_config> local_288;
  basic_value<toml::type_config> local_1c0;
  basic_value<toml::type_config> local_f8;
  
  toml::basic_value<toml::type_config>::basic_value(&local_288);
  fileops::loadToml((value *)local_698,tomlString);
  pbVar31 = (basic_value<toml::type_config> *)local_698;
  local_6a0 = (undefined1  [8])this;
  toml::basic_value<toml::type_config>::operator=(&local_288,pbVar31);
  toml::basic_value<toml::type_config>::cleanup
            ((basic_value<toml::type_config> *)local_698,(EVP_PKEY_CTX *)pbVar31);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5e8);
  toml::detail::region::~region(&local_650);
  local_6c1 = false;
  local_698._0_8_ = local_688;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"defaultglobal","");
  fileops::replaceIfMember<bool>(&local_288,(string *)local_698,&local_6c1);
  if ((undefined1 *)local_698._0_8_ != local_688) {
    operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
  }
  local_698._0_8_ = local_688;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"filters","");
  bVar14 = fileops::isMember(&local_288,(string *)local_698);
  if ((undefined1 *)local_698._0_8_ != local_688) {
    operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
  }
  if (bVar14) {
    local_698._0_8_ = local_688;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"filters","");
    pvVar18 = toml::basic_value<toml::type_config>::at(&local_288,(key_type *)local_698);
    if ((undefined1 *)local_698._0_8_ != local_688) {
      operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
    }
    if (pvVar18->type_ != array) {
      pHVar27 = (HelicsException *)__cxa_allocate_exception(0x28);
      message_04._M_str = "filters section in toml file must be an array";
      message_04._M_len = 0x2d;
      HelicsException::HelicsException(pHVar27,message_04);
      *(undefined ***)pHVar27 = &PTR__HelicsException_0054b1d8;
      __cxa_throw(pHVar27,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
    }
    paVar19 = toml::basic_value<toml::type_config>::as_array(pvVar18);
    pbVar36 = (paVar19->
              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_3e8 = (paVar19->
                super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar36 != local_3e8) {
      local_2e0 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_4f8;
      auStack_4f8._32_8_ = &local_5e8;
      do {
        local_698._0_8_ = local_688;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"name","");
        bVar14 = toml::basic_value<toml::type_config>::contains(pbVar36,(key_type *)local_698);
        if (bVar14) {
          pvVar18 = toml::basic_value<toml::type_config>::at(pbVar36,(key_type *)local_698);
          fileops::tomlAsString_abi_cxx11_(&local_430,(fileops *)pvVar18,element);
        }
        else {
          local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
          local_430._M_string_length = 0;
          local_430.field_2._M_local_buf[0] = '\0';
        }
        if ((undefined1 *)local_698._0_8_ != local_688) {
          operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
        }
        local_698._0_8_ = local_688;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"cloning","");
        local_5a8._0_8_ = local_5a8._0_8_ & 0xffffffffffffff00;
        pbVar20 = toml::find_or<bool,toml::type_config,std::__cxx11::string>
                            (pbVar36,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_698,(bool *)local_5a8);
        local_3f0 = (pointer)CONCAT71(local_3f0._1_7_,*pbVar20);
        if ((undefined1 *)local_698._0_8_ != local_688) {
          operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
        }
        local_698._0_8_ = local_688;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"inputType","");
        bVar14 = toml::basic_value<toml::type_config>::contains(pbVar36,(key_type *)local_698);
        if (bVar14) {
          pvVar18 = toml::basic_value<toml::type_config>::at(pbVar36,(key_type *)local_698);
          fileops::tomlAsString_abi_cxx11_((string *)&local_490,(fileops *)pvVar18,element_00);
        }
        else {
          local_490._M_allocated_capacity = (size_type)&local_480;
          local_490._8_8_ = (EVP_PKEY_CTX *)0x0;
          local_480._M_local_buf[0] = '\0';
        }
        if ((undefined1 *)local_698._0_8_ != local_688) {
          operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
        }
        local_698._0_8_ = local_688;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"outputType","");
        bVar14 = toml::basic_value<toml::type_config>::contains(pbVar36,(key_type *)local_698);
        if (bVar14) {
          pvVar18 = toml::basic_value<toml::type_config>::at(pbVar36,(key_type *)local_698);
          fileops::tomlAsString_abi_cxx11_(&local_450,(fileops *)pvVar18,element_01);
        }
        else {
          local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
          local_450._M_string_length = 0;
          local_450.field_2._M_local_buf[0] = '\0';
        }
        if ((undefined1 *)local_698._0_8_ != local_688) {
          operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
        }
        bVar16 = (value<fmt::v11::context> *)local_450._M_string_length !=
                 (value<fmt::v11::context> *)0x0;
        bVar9 = (EVP_PKEY_CTX *)local_490._8_8_ != (EVP_PKEY_CTX *)0x0;
        local_698._0_8_ = local_688;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"global","");
        local_5a8[0] = local_6c1;
        pbVar20 = toml::find_or<bool,toml::type_config,std::__cxx11::string>
                            (pbVar36,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_698,(bool *)local_5a8);
        bVar14 = *pbVar20;
        if ((undefined1 *)local_698._0_8_ != local_688) {
          operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
        }
        local_698._0_8_ = local_688;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"operation","");
        local_5a8._0_8_ = local_598;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5a8,"custom","");
        uVar12 = local_5a8._8_8_;
        uVar11 = local_5a8._0_8_;
        bVar15 = toml::basic_value<toml::type_config>::contains(pbVar36,(key_type *)local_698);
        if (bVar15) {
          pvVar18 = toml::basic_value<toml::type_config>::at(pbVar36,(key_type *)local_698);
          fileops::tomlAsString_abi_cxx11_(&local_470,(fileops *)pvVar18,element_02);
        }
        else {
          local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_470,uVar11,(EVP_PKEY_CTX *)(uVar12 + uVar11));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598) {
          operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
        }
        if ((undefined1 *)local_698._0_8_ != local_688) {
          operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
        }
        filterType._M_str = in_stack_fffffffffffff8e8;
        filterType._M_len = (size_t)in_stack_fffffffffffff8e0._M_p;
        opType = filterTypeFromString(filterType);
        bVar16 = checkValidFilterType((Federate *)local_6a0,bVar16 || bVar9,opType,&local_470);
        auVar10 = local_6a0;
        if (bVar16) {
          local_298 = (EVP_PKEY_CTX *)local_490._8_8_;
          paStack_290 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_490._M_allocated_capacity;
          local_2a8.values_ = (value<fmt::v11::context> *)local_450._M_string_length;
          paStack_2a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_450._M_dataplus._M_p;
          in_R9._4_4_ = 0;
          in_R9._0_4_ = opType;
          inputType_00._M_str = (char *)local_490._M_allocated_capacity;
          inputType_00._M_len = local_490._8_8_;
          outputType_00._M_str = local_450._M_dataplus._M_p;
          outputType_00._M_len = local_450._M_string_length;
          name._M_str = local_430._M_dataplus._M_p;
          name._M_len = local_430._M_string_length;
          in_stack_fffffffffffff8e0._M_p = local_450._M_dataplus._M_p;
          callback.filter =
               generateFilter((Federate *)local_6a0,bVar14,(bool)(char)local_3f0,name,opType,
                              inputType_00,outputType_00);
          local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
          local_6e8.field_2._M_local_buf[4] = 's';
          local_6e8.field_2._M_allocated_capacity._0_4_ = 0x67616c66;
          local_6e8._M_string_length = 5;
          local_6e8.field_2._M_local_buf[5] = '\0';
          local_6c0._8_8_ = auVar10;
          local_6c0._0_8_ = callback.filter;
          toml::basic_value<toml::type_config>::basic_value
                    ((basic_value<toml::type_config> *)local_698);
          peVar21 = toml::find_or<toml::type_config,std::__cxx11::string>
                              (pbVar36,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(local_6f8 + 0x10),
                               (basic_value<toml::type_config> *)local_698);
          toml::basic_value<toml::type_config>::basic_value
                    ((basic_value<toml::type_config> *)local_5a8,peVar21);
          if ((string)local_5a8[0] != (string)0x0) {
            if ((string)local_5a8[0] == (string)0x9) {
              paVar19 = toml::basic_value<toml::type_config>::as_array
                                  ((basic_value<toml::type_config> *)local_5a8);
              pbVar1 = (paVar19->
                       super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              for (pbVar29 = (paVar19->
                             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                             )._M_impl.super__Vector_impl_data._M_start; pbVar29 != pbVar1;
                  pbVar29 = pbVar29 + 1) {
                peVar21 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                           *)toml::basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar29);
                loadOptions<toml::basic_value<toml::type_config>,_helics::Filter>::
                anon_class_16_2_14a9c628::operator()
                          ((anon_class_16_2_14a9c628 *)local_6c0,(string *)peVar21);
              }
            }
            else {
              peVar21 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                         *)toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                                     ((basic_value<toml::type_config> *)local_5a8);
              loadOptions<toml::basic_value<toml::type_config>,_helics::Filter>::
              anon_class_16_2_14a9c628::operator()
                        ((anon_class_16_2_14a9c628 *)local_6c0,(string *)peVar21);
            }
          }
          if (((undefined1 *)((long)local_6e8._M_dataplus._M_p - 1))[local_6e8._M_string_length] ==
              's') {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_6f8 + 0x10));
            local_708._0_8_ = local_6f8;
            local_708._8_8_ =
                 (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                  *)0x0;
            local_6f8._0_8_ = local_6f8._0_8_ & 0xffffffffffffff00;
            peVar21 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                       *)toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                                   (pbVar36,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)(local_6f8 + 0x10),
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_708);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_708
                      ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)peVar21)
            ;
            if ((enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                 *)local_708._8_8_ !=
                (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                 *)0x0) {
              peVar21 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                         *)local_708;
              loadOptions<toml::basic_value<toml::type_config>,_helics::Filter>::
              anon_class_16_2_14a9c628::operator()
                        ((anon_class_16_2_14a9c628 *)local_6c0,(string *)peVar21);
            }
            if ((Filter *)local_708._0_8_ != (Filter *)local_6f8) {
              peVar21 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                         *)(local_6f8._0_8_ + 1);
              operator_delete((void *)local_708._0_8_,(ulong)peVar21);
            }
          }
          toml::basic_value<toml::type_config>::cleanup
                    ((basic_value<toml::type_config> *)local_5a8,(EVP_PKEY_CTX *)peVar21);
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(local_2e0);
          toml::detail::region::~region(&local_560);
          toml::basic_value<toml::type_config>::cleanup
                    ((basic_value<toml::type_config> *)local_698,(EVP_PKEY_CTX *)peVar21);
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_4f8._32_8_);
          toml::detail::region::~region(&local_650);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
            operator_delete(local_6e8._M_dataplus._M_p,
                            CONCAT26(local_6e8.field_2._M_allocated_capacity._6_2_,
                                     CONCAT15(local_6e8.field_2._M_local_buf[5],
                                              CONCAT14(local_6e8.field_2._M_local_buf[4],
                                                       local_6e8.field_2._M_allocated_capacity._0_4_
                                                      ))) + 1);
          }
          local_698._0_8_ = (pointer)0x0;
          local_698._8_8_ = 0;
          local_688._8_8_ =
               std::
               _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1312:9)>
               ::_M_invoke;
          local_688._0_8_ =
               std::
               _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1312:9)>
               ::_M_manager;
          local_5a8._0_8_ = (void *)0x0;
          local_5a8._8_8_ = (EVP_PKEY_CTX *)0x0;
          local_598._8_8_ =
               std::
               _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1313:9)>
               ::_M_invoke;
          local_598._0_8_ =
               std::
               _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1313:9)>
               ::_M_manager;
          local_708._8_8_ =
               (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *
               )0x0;
          local_6f8._8_8_ =
               std::
               _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1314:9)>
               ::_M_invoke;
          local_6f8._0_8_ =
               std::
               _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1314:9)>
               ::_M_manager;
          local_708._0_8_ = callback.filter;
          processOptions(pbVar36,(function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                  *)local_698,
                         (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)local_5a8,(function<void_(int,_int)> *)local_708);
          if ((_func_int **)local_6f8._0_8_ != (_func_int **)0x0) {
            (*(code *)local_6f8._0_8_)(local_708,local_708,3);
          }
          if ((code *)local_598._0_8_ != (code *)0x0) {
            (*(code *)local_598._0_8_)(local_5a8,local_5a8,3);
          }
          if ((code *)local_688._0_8_ != (code *)0x0) {
            (*(code *)local_688._0_8_)((key_type *)local_698,(key_type *)local_698,3);
          }
          local_698._8_8_ = 4;
          local_688._0_5_ = 0x6f666e69;
          local_698._0_8_ = local_688;
          bVar14 = toml::basic_value<toml::type_config>::contains(pbVar36,(key_type *)local_698);
          if (bVar14) {
            pvVar18 = toml::basic_value<toml::type_config>::at(pbVar36,(key_type *)local_698);
            fileops::tomlAsString_abi_cxx11_(&local_410,(fileops *)pvVar18,element_03);
          }
          else {
            local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
            local_410._M_string_length = 0;
            local_410.field_2._M_local_buf[0] = '\0';
          }
          if ((undefined1 *)local_698._0_8_ != local_688) {
            operator_delete((void *)local_698._0_8_,local_688._0_8_ + 1);
          }
          if (local_410._M_string_length != 0) {
            pCVar2 = ((callback.filter)->super_Interface).mCore;
            (*pCVar2->_vptr_Core[0x60])
                      (pCVar2,(ulong)(uint)((callback.filter)->super_Interface).handle.hid);
          }
          local_698._8_8_ = 0;
          local_688._8_8_ =
               std::
               _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1320:20)>
               ::_M_invoke;
          local_688._0_8_ =
               std::
               _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1320:20)>
               ::_M_manager;
          local_698._0_8_ = callback.filter;
          loadTags(pbVar36,(function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                            *)local_698);
          if ((code *)local_688._0_8_ != (code *)0x0) {
            (*(code *)local_688._0_8_)(local_698,local_698,3);
          }
          local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
          local_5c8.field_2._M_allocated_capacity._4_2_ = 0x6563;
          local_5c8.field_2._M_allocated_capacity._0_4_ = 0x72756f73;
          local_5c8._M_string_length = 6;
          local_5c8.field_2._M_local_buf[6] = '\0';
          local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
          local_4b0.field_2._M_allocated_capacity._0_4_ = 0x67726174;
          local_4b0._M_string_length = 7;
          local_4b0.field_2._M_allocated_capacity._4_4_ = 0x737465;
          local_5a8._0_8_ = local_598;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5a8,local_5c8._M_dataplus._M_p,
                     (undefined1 *)((long)&local_5c8.field_2 + 6));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,"_")
          ;
          pbVar22 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5a8,local_4b0._M_dataplus._M_p,local_4b0._M_string_length);
          local_698._0_8_ = (pbVar22->_M_dataplus)._M_p;
          paVar28 = &pbVar22->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ == paVar28) {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
            local_688._8_8_ = *(undefined8 *)((long)&pbVar22->field_2 + 8);
            local_698._0_8_ = local_688;
          }
          else {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
          }
          local_698._8_8_ = pbVar22->_M_string_length;
          (pbVar22->_M_dataplus)._M_p = (pointer)paVar28;
          pbVar22->_M_string_length = 0;
          (pbVar22->field_2)._M_local_buf[0] = '\0';
          bVar14 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Filter>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_4_>
                             (pbVar36,(string *)local_698,(anon_class_8_1_a8116966)callback.filter);
          if ((undefined1 *)local_698._0_8_ != local_688) {
            operator_delete((void *)local_698._0_8_,local_688._0_8_ + 1);
          }
          if ((undefined1 *)local_5a8._0_8_ != local_598) {
            operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
          }
          if (!bVar14) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_708,&local_5c8,&local_4b0);
            bVar14 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Filter>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_4_>
                               (pbVar36,(string *)local_708,(anon_class_8_1_a8116966)callback.filter
                               );
            if ((Filter *)local_708._0_8_ != (Filter *)local_6f8) {
              operator_delete((void *)local_708._0_8_,(ulong)(local_6f8._0_8_ + 1));
            }
            _Var13._M_p = local_4b0._M_dataplus._M_p;
            if (!bVar14) {
              iVar17 = toupper((int)*local_4b0._M_dataplus._M_p);
              *_Var13._M_p = (char)iVar17;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6c0,&local_5c8,&local_4b0);
              addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Filter>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_4_>
                        (pbVar36,(string *)local_6c0,(anon_class_8_1_a8116966)callback.filter);
              if ((Filter *)local_6c0._0_8_ != (Filter *)(local_6c0 + 0x10)) {
                operator_delete((void *)local_6c0._0_8_,(ulong)(local_6c0._16_8_ + 1));
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
            operator_delete(local_4b0._M_dataplus._M_p,
                            CONCAT44(local_4b0.field_2._M_allocated_capacity._4_4_,
                                     local_4b0.field_2._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
            operator_delete(local_5c8._M_dataplus._M_p,
                            CONCAT17(local_5c8.field_2._M_local_buf[7],
                                     CONCAT16(local_5c8.field_2._M_local_buf[6],
                                              CONCAT24(local_5c8.field_2._M_allocated_capacity._4_2_
                                                       ,local_5c8.field_2._M_allocated_capacity.
                                                        _0_4_))) + 1);
          }
          local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
          local_5c8.field_2._M_allocated_capacity._0_4_ = 0x74736564;
          local_5c8.field_2._M_allocated_capacity._4_2_ = 0x6e69;
          local_5c8.field_2._M_local_buf[6] = 'a';
          local_5c8.field_2._7_4_ = 0x6e6f6974;
          local_5c8._M_string_length = 0xb;
          local_5c8.field_2._M_local_buf[0xb] = '\0';
          auStack_4f8._40_8_ = &local_4c0;
          local_4c0._M_allocated_capacity._0_4_ = 0x67726174;
          auStack_4f8._48_8_ = 7;
          local_4c0._M_allocated_capacity._4_4_ = 0x737465;
          local_5a8._0_8_ = local_598;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5a8,local_5c8._M_dataplus._M_p,
                     (undefined1 *)((long)&local_5c8.field_2 + 0xb));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,"_")
          ;
          pbVar22 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5a8,(char *)auStack_4f8._40_8_,auStack_4f8._48_8_);
          local_698._0_8_ = (pbVar22->_M_dataplus)._M_p;
          paVar28 = &pbVar22->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ == paVar28) {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
            local_688._8_8_ = *(undefined8 *)((long)&pbVar22->field_2 + 8);
            local_698._0_8_ = local_688;
          }
          else {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
          }
          local_698._8_8_ = pbVar22->_M_string_length;
          (pbVar22->_M_dataplus)._M_p = (pointer)paVar28;
          pbVar22->_M_string_length = 0;
          (pbVar22->field_2)._M_local_buf[0] = '\0';
          bVar14 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Filter>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_5_>
                             (pbVar36,(string *)local_698,(anon_class_8_1_a8116966)callback.filter);
          if ((undefined1 *)local_698._0_8_ != local_688) {
            operator_delete((void *)local_698._0_8_,local_688._0_8_ + 1);
          }
          if ((undefined1 *)local_5a8._0_8_ != local_598) {
            operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
          }
          if (!bVar14) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_708,&local_5c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (auStack_4f8 + 0x28));
            bVar14 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Filter>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_5_>
                               (pbVar36,(string *)local_708,(anon_class_8_1_a8116966)callback.filter
                               );
            if ((Filter *)local_708._0_8_ != (Filter *)local_6f8) {
              operator_delete((void *)local_708._0_8_,(ulong)(local_6f8._0_8_ + 1));
            }
            uVar11 = auStack_4f8._40_8_;
            if (!bVar14) {
              iVar17 = toupper((int)*(char *)auStack_4f8._40_8_);
              *(char *)uVar11 = (char)iVar17;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6c0,&local_5c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (auStack_4f8 + 0x28));
              addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Filter>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_5_>
                        (pbVar36,(string *)local_6c0,(anon_class_8_1_a8116966)callback.filter);
              if ((Filter *)local_6c0._0_8_ != (Filter *)(local_6c0 + 0x10)) {
                operator_delete((void *)local_6c0._0_8_,(ulong)(local_6c0._16_8_ + 1));
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)auStack_4f8._40_8_ != &local_4c0) {
            operator_delete((void *)auStack_4f8._40_8_,
                            CONCAT44(local_4c0._M_allocated_capacity._4_4_,
                                     local_4c0._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
            operator_delete(local_5c8._M_dataplus._M_p,
                            CONCAT17(local_5c8.field_2._M_local_buf[7],
                                     CONCAT16(local_5c8.field_2._M_local_buf[6],
                                              CONCAT24(local_5c8.field_2._M_allocated_capacity._4_2_
                                                       ,local_5c8.field_2._M_allocated_capacity.
                                                        _0_4_))) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,
                            CONCAT71(local_410.field_2._M_allocated_capacity._1_7_,
                                     local_410.field_2._M_local_buf[0]) + 1);
          }
          local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_6f8 + 0x10),"source","");
          local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"endpoints","");
          local_5a8._0_8_ = local_598;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5a8,local_6e8._M_dataplus._M_p,
                     local_6e8._M_string_length + local_6e8._M_dataplus._M_p);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,"_")
          ;
          pbVar22 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5a8,local_300._M_dataplus._M_p,local_300._M_string_length);
          local_698._0_8_ = (pbVar22->_M_dataplus)._M_p;
          paVar28 = &pbVar22->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ == paVar28) {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
            local_688._8_8_ = *(undefined8 *)((long)&pbVar22->field_2 + 8);
            local_698._0_8_ = local_688;
          }
          else {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
          }
          local_698._8_8_ = pbVar22->_M_string_length;
          (pbVar22->_M_dataplus)._M_p = (pointer)paVar28;
          pbVar22->_M_string_length = 0;
          (pbVar22->field_2)._M_local_buf[0] = '\0';
          bVar14 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__3>
                             (pbVar36,(string *)local_698,callback);
          if ((undefined1 *)local_698._0_8_ != local_688) {
            operator_delete((void *)local_698._0_8_,local_688._0_8_ + 1);
          }
          if ((undefined1 *)local_5a8._0_8_ != local_598) {
            operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
          }
          if (!bVar14) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_708,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_6f8 + 0x10),&local_300);
            bVar14 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__3>
                               (pbVar36,(string *)local_708,callback);
            if ((Filter *)local_708._0_8_ != (Filter *)local_6f8) {
              operator_delete((void *)local_708._0_8_,(ulong)(local_6f8._0_8_ + 1));
            }
            _Var13._M_p = local_300._M_dataplus._M_p;
            if (!bVar14) {
              iVar17 = toupper((int)*local_300._M_dataplus._M_p);
              *_Var13._M_p = (char)iVar17;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6c0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_6f8 + 0x10),&local_300);
              addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__3>
                        (pbVar36,(string *)local_6c0,callback);
              if ((Filter *)local_6c0._0_8_ != (Filter *)(local_6c0 + 0x10)) {
                operator_delete((void *)local_6c0._0_8_,(ulong)(local_6c0._16_8_ + 1));
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_300._M_dataplus._M_p != &local_300.field_2) {
            operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
            operator_delete(local_6e8._M_dataplus._M_p,
                            CONCAT26(local_6e8.field_2._M_allocated_capacity._6_2_,
                                     CONCAT15(local_6e8.field_2._M_local_buf[5],
                                              CONCAT14(local_6e8.field_2._M_local_buf[4],
                                                       local_6e8.field_2._M_allocated_capacity._0_4_
                                                      ))) + 1);
          }
          local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_6f8 + 0x10),"destination","");
          local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"endpoints","");
          local_5a8._0_8_ = local_598;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5a8,local_6e8._M_dataplus._M_p,
                     local_6e8._M_string_length + local_6e8._M_dataplus._M_p);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,"_")
          ;
          pbVar22 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5a8,local_320._M_dataplus._M_p,local_320._M_string_length);
          local_698._0_8_ = (pbVar22->_M_dataplus)._M_p;
          paVar28 = &pbVar22->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ == paVar28) {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
            local_688._8_8_ = *(undefined8 *)((long)&pbVar22->field_2 + 8);
            local_698._0_8_ = local_688;
          }
          else {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
          }
          local_698._8_8_ = pbVar22->_M_string_length;
          (pbVar22->_M_dataplus)._M_p = (pointer)paVar28;
          pbVar22->_M_string_length = 0;
          (pbVar22->field_2)._M_local_buf[0] = '\0';
          bVar14 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__4>
                             (pbVar36,(string *)local_698,callback);
          if ((undefined1 *)local_698._0_8_ != local_688) {
            operator_delete((void *)local_698._0_8_,local_688._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_598) {
            operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
          }
          if (!bVar14) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_708,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_6f8 + 0x10),&local_320);
            bVar14 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__4>
                               (pbVar36,(string *)local_708,callback);
            if ((Filter *)local_708._0_8_ != (Filter *)local_6f8) {
              operator_delete((void *)local_708._0_8_,(ulong)(local_6f8._0_8_ + 1));
            }
            _Var13._M_p = local_320._M_dataplus._M_p;
            if (!bVar14) {
              iVar17 = toupper((int)*local_320._M_dataplus._M_p);
              *_Var13._M_p = (char)iVar17;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6c0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_6f8 + 0x10),&local_320);
              addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__4>
                        (pbVar36,(string *)local_6c0,callback);
              if ((Filter *)local_6c0._0_8_ != (Filter *)(local_6c0 + 0x10)) {
                operator_delete((void *)local_6c0._0_8_,(ulong)(local_6c0._16_8_ + 1));
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._M_dataplus._M_p != &local_320.field_2) {
            operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
            operator_delete(local_6e8._M_dataplus._M_p,
                            CONCAT26(local_6e8.field_2._M_allocated_capacity._6_2_,
                                     CONCAT15(local_6e8.field_2._M_local_buf[5],
                                              CONCAT14(local_6e8.field_2._M_local_buf[4],
                                                       local_6e8.field_2._M_allocated_capacity._0_4_
                                                      ))) + 1);
          }
          if ((char)local_3f0 != '\0') {
            local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"delivery","");
            toml::basic_value<toml::type_config>::basic_value
                      ((basic_value<toml::type_config> *)local_698);
            peVar21 = toml::find_or<toml::type_config,std::__cxx11::string>
                                (pbVar36,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&local_2d8,(basic_value<toml::type_config> *)local_698);
            toml::basic_value<toml::type_config>::basic_value
                      ((basic_value<toml::type_config> *)local_5a8,peVar21);
            if ((string)local_5a8[0] != (string)0x0) {
              if ((string)local_5a8[0] == (string)0x9) {
                paVar19 = toml::basic_value<toml::type_config>::as_array
                                    ((basic_value<toml::type_config> *)local_5a8);
                pbVar1 = (paVar19->
                         super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
                for (pbVar29 = (paVar19->
                               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                               )._M_impl.super__Vector_impl_data._M_start; pbVar29 != pbVar1;
                    pbVar29 = pbVar29 + 1) {
                  psVar23 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar29);
                  peVar21 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                             *)psVar23->_M_string_length;
                  endpoint._M_str = (psVar23->_M_dataplus)._M_p;
                  endpoint._M_len = (size_t)peVar21;
                  CloningFilter::addDeliveryEndpoint((CloningFilter *)callback.filter,endpoint);
                }
              }
              else {
                psVar23 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                                    ((basic_value<toml::type_config> *)local_5a8);
                peVar21 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                           *)psVar23->_M_string_length;
                endpoint_00._M_str = (psVar23->_M_dataplus)._M_p;
                endpoint_00._M_len = (size_t)peVar21;
                CloningFilter::addDeliveryEndpoint((CloningFilter *)callback.filter,endpoint_00);
              }
            }
            if (local_2d8._M_dataplus._M_p[local_2d8._M_string_length - 1] == 's') {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              pop_back(&local_2d8);
              local_708._0_8_ = local_6f8;
              local_708._8_8_ =
                   (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                    *)0x0;
              local_6f8._0_8_ = local_6f8._0_8_ & 0xffffffffffffff00;
              pbVar24 = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                                  (pbVar36,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&local_2d8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_708);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_708,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar24
                       );
              peVar21 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                         *)local_708._8_8_;
              if ((enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                   *)local_708._8_8_ !=
                  (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                   *)0x0) {
                endpoint_01._M_str = (char *)local_708._0_8_;
                endpoint_01._M_len = local_708._8_8_;
                CloningFilter::addDeliveryEndpoint((CloningFilter *)callback.filter,endpoint_01);
              }
              if ((Filter *)local_708._0_8_ != (Filter *)local_6f8) {
                peVar21 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                           *)(local_6f8._0_8_ + 1);
                operator_delete((void *)local_708._0_8_,(ulong)peVar21);
              }
            }
            toml::basic_value<toml::type_config>::cleanup
                      ((basic_value<toml::type_config> *)local_5a8,(EVP_PKEY_CTX *)peVar21);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(local_2e0);
            toml::detail::region::~region(&local_560);
            toml::basic_value<toml::type_config>::cleanup
                      ((basic_value<toml::type_config> *)local_698,(EVP_PKEY_CTX *)peVar21);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_4f8._32_8_);
            toml::detail::region::~region(&local_650);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
              operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          bVar14 = *(bool *)((long)local_6a0 + 10);
          local_688._0_8_ = (code *)0x69747265706f7270;
          local_698._8_8_ = 10;
          local_688._8_3_ = 0x7365;
          local_698._0_8_ = local_688;
          bVar16 = fileops::isMember(pbVar36,(string *)local_698);
          if ((undefined1 *)local_698._0_8_ != local_688) {
            operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
          }
          if (bVar16) {
            local_688._0_8_ = (code *)0x69747265706f7270;
            local_698._8_8_ = 10;
            local_688._8_3_ = 0x7365;
            local_698._0_8_ = local_688;
            pvVar18 = toml::basic_value<toml::type_config>::at(pbVar36,(key_type *)local_698);
            if ((undefined1 *)local_698._0_8_ != local_688) {
              operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
            }
            if (pvVar18->type_ == array) {
              paVar19 = toml::basic_value<toml::type_config>::as_array(pvVar18);
              pbVar3 = (paVar19->
                       super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              for (pbVar31 = (paVar19->
                             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                             )._M_impl.super__Vector_impl_data._M_start; pbVar31 != pbVar3;
                  pbVar31 = pbVar31 + 1) {
                local_5a8._0_8_ = local_598;
                local_5a8._8_8_ = (EVP_PKEY_CTX *)0x0;
                local_598._0_8_ = local_598._0_8_ & 0xffffffffffffff00;
                pbVar24 = toml::find_or<std::__cxx11::string,toml::type_config,char[5]>
                                    (pbVar31,(char (*) [5])0x43fbf7,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_5a8);
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::_M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_5a8,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            pbVar24);
                toml::basic_value<toml::type_config>::basic_value
                          ((basic_value<toml::type_config> *)local_698);
                peVar21 = toml::find_or<toml::type_config,char[6]>
                                    (pbVar31,(char (*) [6])0x4210ea,
                                     (basic_value<toml::type_config> *)local_698);
                pEVar32 = (EVP_PKEY_CTX *)local_5a8._8_8_;
                uVar11 = local_5a8._0_8_;
                if ((EVP_PKEY_CTX *)local_5a8._8_8_ == (EVP_PKEY_CTX *)0x0) {
LAB_0023e997:
                  if (bVar14 != false) {
                    message_11._M_str = "interface properties require \"name\" and \"value\" fields"
                    ;
                    message_11._M_len = 0x36;
                    logMessage((Federate *)local_6a0,0,message_11);
                    pHVar27 = (HelicsException *)__cxa_allocate_exception(0x28);
                    message._M_str = "interface properties require \"name\" and \"value\" fields";
                    message._M_len = 0x36;
                    HelicsException::HelicsException(pHVar27,message);
                    *(undefined ***)pHVar27 = &PTR__HelicsException_0054b1d8;
                    __cxa_throw(pHVar27,&InvalidParameter::typeinfo,
                                HelicsException::~HelicsException);
                  }
                  pEVar32 = (EVP_PKEY_CTX *)0x3;
                  message_06._M_str = "interface properties require \"name\" and \"value\" fields";
                  message_06._M_len = 0x36;
                  logMessage((Federate *)local_6a0,3,message_06);
                }
                else if (peVar21->type_ == floating) {
                  pfVar25 = toml::basic_value<toml::type_config>::as_floating(peVar21);
                  (*((callback.filter)->super_Interface)._vptr_Interface[5])
                            (SUB84(*pfVar25,0),callback.filter,pEVar32,uVar11);
                }
                else {
                  if (peVar21->type_ == empty) goto LAB_0023e997;
                  psVar23 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(peVar21);
                  (*((callback.filter)->super_Interface)._vptr_Interface[6])
                            (callback.filter,pEVar32,uVar11,psVar23->_M_string_length,
                             (psVar23->_M_dataplus)._M_p);
                }
                toml::basic_value<toml::type_config>::cleanup
                          ((basic_value<toml::type_config> *)local_698,pEVar32);
                CLI::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_4f8._32_8_);
                toml::detail::region::~region(&local_650);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5a8._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_598) {
                  operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
                }
              }
            }
            else {
              local_5a8._0_8_ = local_598;
              local_5a8._8_8_ = (EVP_PKEY_CTX *)0x0;
              local_598._0_8_ = local_598._0_8_ & 0xffffffffffffff00;
              pbVar24 = toml::find_or<std::__cxx11::string,toml::type_config,char[5]>
                                  (pvVar18,(char (*) [5])0x43fbf7,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_5a8);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_5a8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar24
                       );
              toml::basic_value<toml::type_config>::basic_value
                        ((basic_value<toml::type_config> *)local_698);
              peVar21 = toml::find_or<toml::type_config,char[6]>
                                  (pvVar18,(char (*) [6])0x4210ea,
                                   (basic_value<toml::type_config> *)local_698);
              pEVar32 = (EVP_PKEY_CTX *)local_5a8._8_8_;
              uVar11 = local_5a8._0_8_;
              if ((EVP_PKEY_CTX *)local_5a8._8_8_ == (EVP_PKEY_CTX *)0x0) {
LAB_0023eaf4:
                if (bVar14 != false) {
                  message_14._M_str = "interface properties require \"name\" and \"value\" fields";
                  message_14._M_len = 0x36;
                  logMessage((Federate *)local_6a0,0,message_14);
                  pHVar27 = (HelicsException *)__cxa_allocate_exception(0x28);
                  message_02._M_str = "interface properties require \"name\" and \"value\" fields";
                  message_02._M_len = 0x36;
                  HelicsException::HelicsException(pHVar27,message_02);
                  *(undefined ***)pHVar27 = &PTR__HelicsException_0054b1d8;
                  __cxa_throw(pHVar27,&InvalidParameter::typeinfo,HelicsException::~HelicsException)
                  ;
                }
                pEVar32 = (EVP_PKEY_CTX *)0x3;
                message_07._M_str = "interface properties require \"name\" and \"value\" fields";
                message_07._M_len = 0x36;
                logMessage((Federate *)local_6a0,3,message_07);
              }
              else if (peVar21->type_ == floating) {
                pfVar25 = toml::basic_value<toml::type_config>::as_floating(peVar21);
                (*((callback.filter)->super_Interface)._vptr_Interface[5])
                          (SUB84(*pfVar25,0),callback.filter,pEVar32,uVar11);
              }
              else {
                if (peVar21->type_ == empty) goto LAB_0023eaf4;
                psVar23 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(peVar21);
                (*((callback.filter)->super_Interface)._vptr_Interface[6])
                          (callback.filter,pEVar32,uVar11,psVar23->_M_string_length,
                           (psVar23->_M_dataplus)._M_p);
              }
              toml::basic_value<toml::type_config>::cleanup
                        ((basic_value<toml::type_config> *)local_698,pEVar32);
              CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_4f8._32_8_);
              toml::detail::region::~region(&local_650);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_598) {
                operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
              }
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470._M_dataplus._M_p != &local_470.field_2) {
          operator_delete(local_470._M_dataplus._M_p,
                          CONCAT71(local_470.field_2._M_allocated_capacity._1_7_,
                                   local_470.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != &local_450.field_2) {
          operator_delete(local_450._M_dataplus._M_p,
                          CONCAT71(local_450.field_2._M_allocated_capacity._1_7_,
                                   local_450.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_490._M_allocated_capacity != &local_480) {
          operator_delete((void *)local_490._M_allocated_capacity,
                          CONCAT71(local_480._M_allocated_capacity._1_7_,local_480._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != &local_430.field_2) {
          operator_delete(local_430._M_dataplus._M_p,
                          CONCAT71(local_430.field_2._M_allocated_capacity._1_7_,
                                   local_430.field_2._M_local_buf[0]) + 1);
        }
        pbVar36 = pbVar36 + 1;
      } while (pbVar36 != local_3e8);
    }
  }
  local_698._0_8_ = local_688;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"translators","");
  bVar14 = fileops::isMember(&local_288,(string *)local_698);
  if ((undefined1 *)local_698._0_8_ != local_688) {
    operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
  }
  if (bVar14) {
    local_698._0_8_ = local_688;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"translators","");
    pvVar18 = toml::basic_value<toml::type_config>::at(&local_288,(key_type *)local_698);
    if ((undefined1 *)local_698._0_8_ != local_688) {
      operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
    }
    if (pvVar18->type_ != array) {
      pHVar27 = (HelicsException *)__cxa_allocate_exception(0x28);
      message_05._M_str = "translators section in toml file must be an array";
      message_05._M_len = 0x31;
      HelicsException::HelicsException(pHVar27,message_05);
      *(undefined ***)pHVar27 = &PTR__HelicsException_0054b1d8;
      __cxa_throw(pHVar27,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
    }
    paVar19 = toml::basic_value<toml::type_config>::as_array(pvVar18);
    pbVar36 = (paVar19->
              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_3f0 = (paVar19->
                super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar36 != local_3f0) {
      local_3e8 = (pointer)auStack_4f8;
      auStack_4f8._32_8_ = &local_5e8;
      do {
        local_698._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_688;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"name","");
        bVar14 = toml::basic_value<toml::type_config>::contains(pbVar36,(key_type *)local_698);
        if (bVar14) {
          pvVar18 = toml::basic_value<toml::type_config>::at(pbVar36,(key_type *)local_698);
          fileops::tomlAsString_abi_cxx11_(&local_430,(fileops *)pvVar18,element_04);
        }
        else {
          local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
          local_430._M_string_length = 0;
          local_430.field_2._M_local_buf[0] = '\0';
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_698._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_688) {
          operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
        }
        local_698._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_688;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"type","");
        local_5a8._0_8_ = local_598;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5a8,"custom","");
        uVar12 = local_5a8._8_8_;
        uVar11 = local_5a8._0_8_;
        bVar14 = toml::basic_value<toml::type_config>::contains(pbVar36,(key_type *)local_698);
        if (bVar14) {
          pvVar18 = toml::basic_value<toml::type_config>::at(pbVar36,(key_type *)local_698);
          fileops::tomlAsString_abi_cxx11_((string *)&local_490,(fileops *)pvVar18,element_05);
        }
        else {
          local_490._M_allocated_capacity = (size_type)&local_480;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_490,uVar11,(EVP_PKEY_CTX *)(uVar12 + uVar11));
        }
        if ((undefined1 *)local_5a8._0_8_ != local_598) {
          operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_698._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_688) {
          operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
        }
        translatorType._M_str = in_stack_fffffffffffff8e8;
        translatorType._M_len = (size_t)in_stack_fffffffffffff8e0._M_p;
        ttype = translatorTypeFromString(translatorType);
        local_698._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_688;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"endpointtype","");
        bVar14 = toml::basic_value<toml::type_config>::contains(pbVar36,(key_type *)local_698);
        if (bVar14) {
          pvVar18 = toml::basic_value<toml::type_config>::at(pbVar36,(key_type *)local_698);
          fileops::tomlAsString_abi_cxx11_(&local_450,(fileops *)pvVar18,element_06);
        }
        else {
          local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
          local_450._M_string_length = 0;
          local_450.field_2._M_local_buf[0] = '\0';
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_698._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_688) {
          operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
        }
        local_698._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_688;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"unit","");
        bVar14 = toml::basic_value<toml::type_config>::contains(pbVar36,(key_type *)local_698);
        if (bVar14) {
          pvVar18 = toml::basic_value<toml::type_config>::at(pbVar36,(key_type *)local_698);
          fileops::tomlAsString_abi_cxx11_(&local_470,(fileops *)pvVar18,element_07);
        }
        else {
          local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
          local_470._M_string_length = 0;
          local_470.field_2._M_local_buf[0] = '\0';
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_698._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_688) {
          operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
        }
        local_698._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_688;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"units","");
        fileops::replaceIfMember(pbVar36,(string *)local_698,&local_470);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_698._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_688) {
          operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
        }
        local_698._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_688;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"global","");
        local_5a8[0] = local_6c1;
        pbVar20 = toml::find_or<bool,toml::type_config,std::__cxx11::string>
                            (pbVar36,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_698,(bool *)local_5a8);
        bVar14 = *pbVar20;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_698._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_688) {
          operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
        }
        auVar10 = local_6a0;
        if (ttype == UNRECOGNIZED) {
          if (*(bool *)((long)local_6a0 + 10) == true) {
            local_5a8._0_8_ = local_490._M_allocated_capacity;
            local_5a8._8_8_ = local_490._8_8_;
            fmt_00.size_ = 0xd;
            fmt_00.data_ = (char *)0x1f;
            args_00.field_1.values_ = in_R9.values_;
            args_00.desc_ = (unsigned_long_long)local_5a8;
            ::fmt::v11::vformat_abi_cxx11_
                      ((string *)local_698,(v11 *)"unrecognized translator type:{}",fmt_00,args_00);
            message_13._M_str = (char *)local_698._0_8_;
            message_13._M_len = local_698._8_8_;
            logMessage((Federate *)local_6a0,0,message_13);
            pHVar27 = (HelicsException *)__cxa_allocate_exception(0x28);
            message_01._M_str = (char *)local_698._0_8_;
            message_01._M_len = local_698._8_8_;
            HelicsException::HelicsException(pHVar27,message_01);
            *(undefined ***)pHVar27 = &PTR__HelicsException_0054b1d8;
            __cxa_throw(pHVar27,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
          }
          local_5a8._0_8_ = local_490._M_allocated_capacity;
          local_5a8._8_8_ = local_490._8_8_;
          fmt.size_ = 0xd;
          fmt.data_ = (char *)0x20;
          args.field_1.values_ = in_R9.values_;
          args.desc_ = (unsigned_long_long)local_5a8;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)local_698,(v11 *)"unrecognized filter operation:{}",fmt,args);
          message_08._M_str = (char *)local_698._0_8_;
          message_08._M_len = local_698._8_8_;
          logMessage((Federate *)local_6a0,3,message_08);
          pcVar33 = (code *)local_688._0_8_;
          paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_698._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_688) {
LAB_0023f184:
            operator_delete(paVar35,(ulong)(pcVar33 + 1));
          }
        }
        else {
          local_2b8 = (char *)local_470._M_string_length;
          paStack_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_470._M_dataplus._M_p;
          endpointType._M_str = (char *)local_470._M_string_length;
          endpointType._M_len = (size_t)local_450._M_dataplus._M_p;
          units._M_str = in_stack_fffffffffffff8e0._M_p;
          units._M_len = (size_t)local_470._M_dataplus._M_p;
          name_00._M_str = local_430._M_dataplus._M_p;
          name_00._M_len = local_430._M_string_length;
          in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                  local_450._M_string_length;
          callback_00.iface =
               generateTranslator((Federate *)local_6a0,bVar14,name_00,ttype,endpointType,units);
          local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
          local_6e8.field_2._M_local_buf[4] = 's';
          local_6e8.field_2._M_allocated_capacity._0_4_ = 0x67616c66;
          local_6e8._M_string_length = 5;
          local_6e8.field_2._M_local_buf[5] = '\0';
          local_6c0._8_8_ = auVar10;
          local_6c0._0_8_ = callback_00.iface;
          toml::basic_value<toml::type_config>::basic_value
                    ((basic_value<toml::type_config> *)local_698);
          peVar21 = toml::find_or<toml::type_config,std::__cxx11::string>
                              (pbVar36,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(local_6f8 + 0x10),
                               (basic_value<toml::type_config> *)local_698);
          toml::basic_value<toml::type_config>::basic_value
                    ((basic_value<toml::type_config> *)local_5a8,peVar21);
          if ((string)local_5a8[0] != (string)0x0) {
            if ((string)local_5a8[0] == (string)0x9) {
              paVar19 = toml::basic_value<toml::type_config>::as_array
                                  ((basic_value<toml::type_config> *)local_5a8);
              pbVar1 = (paVar19->
                       super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              for (pbVar29 = (paVar19->
                             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                             )._M_impl.super__Vector_impl_data._M_start; pbVar29 != pbVar1;
                  pbVar29 = pbVar29 + 1) {
                peVar21 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                           *)toml::basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar29);
                loadOptions<toml::basic_value<toml::type_config>,_helics::Translator>::
                anon_class_16_2_14a9c628::operator()
                          ((anon_class_16_2_14a9c628 *)local_6c0,(string *)peVar21);
              }
            }
            else {
              peVar21 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                         *)toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                                     ((basic_value<toml::type_config> *)local_5a8);
              loadOptions<toml::basic_value<toml::type_config>,_helics::Translator>::
              anon_class_16_2_14a9c628::operator()
                        ((anon_class_16_2_14a9c628 *)local_6c0,(string *)peVar21);
            }
          }
          if (((undefined1 *)((long)local_6e8._M_dataplus._M_p - 1))[local_6e8._M_string_length] ==
              's') {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_6f8 + 0x10));
            local_708._0_8_ = local_6f8;
            local_708._8_8_ =
                 (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                  *)0x0;
            local_6f8._0_8_ = local_6f8._0_8_ & 0xffffffffffffff00;
            peVar21 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                       *)toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                                   (pbVar36,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)(local_6f8 + 0x10),
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_708);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_708
                      ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)peVar21)
            ;
            if ((enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                 *)local_708._8_8_ !=
                (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                 *)0x0) {
              peVar21 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                         *)local_708;
              loadOptions<toml::basic_value<toml::type_config>,_helics::Translator>::
              anon_class_16_2_14a9c628::operator()
                        ((anon_class_16_2_14a9c628 *)local_6c0,(string *)peVar21);
            }
            if ((Filter *)local_708._0_8_ != (Filter *)local_6f8) {
              peVar21 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                         *)(local_6f8._0_8_ + 1);
              operator_delete((void *)local_708._0_8_,(ulong)peVar21);
            }
          }
          toml::basic_value<toml::type_config>::cleanup
                    ((basic_value<toml::type_config> *)local_5a8,(EVP_PKEY_CTX *)peVar21);
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_3e8);
          toml::detail::region::~region(&local_560);
          toml::basic_value<toml::type_config>::cleanup
                    ((basic_value<toml::type_config> *)local_698,(EVP_PKEY_CTX *)peVar21);
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_4f8._32_8_);
          toml::detail::region::~region(&local_650);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
            operator_delete(local_6e8._M_dataplus._M_p,
                            CONCAT26(local_6e8.field_2._M_allocated_capacity._6_2_,
                                     CONCAT15(local_6e8.field_2._M_local_buf[5],
                                              CONCAT14(local_6e8.field_2._M_local_buf[4],
                                                       local_6e8.field_2._M_allocated_capacity._0_4_
                                                      ))) + 1);
          }
          local_698._0_8_ = (pointer)0x0;
          local_698._8_8_ = 0;
          local_688._8_8_ =
               std::
               _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1312:9)>
               ::_M_invoke;
          local_688._0_8_ =
               std::
               _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1312:9)>
               ::_M_manager;
          local_5a8._0_8_ = (void *)0x0;
          local_5a8._8_8_ = (EVP_PKEY_CTX *)0x0;
          local_598._8_8_ =
               std::
               _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1313:9)>
               ::_M_invoke;
          local_598._0_8_ =
               std::
               _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1313:9)>
               ::_M_manager;
          local_708._8_8_ =
               (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *
               )0x0;
          local_6f8._8_8_ =
               std::
               _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1314:9)>
               ::_M_invoke;
          local_6f8._0_8_ =
               std::
               _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1314:9)>
               ::_M_manager;
          local_708._0_8_ = callback_00.iface;
          processOptions(pbVar36,(function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                  *)local_698,
                         (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)local_5a8,(function<void_(int,_int)> *)local_708);
          if ((_func_int **)local_6f8._0_8_ != (_func_int **)0x0) {
            (*(code *)local_6f8._0_8_)(local_708,local_708,3);
          }
          if ((code *)local_598._0_8_ != (code *)0x0) {
            (*(code *)local_598._0_8_)(local_5a8,local_5a8,3);
          }
          if ((code *)local_688._0_8_ != (code *)0x0) {
            (*(code *)local_688._0_8_)((key_type *)local_698,(key_type *)local_698,3);
          }
          local_698._8_8_ = 4;
          local_688._0_5_ = 0x6f666e69;
          local_698._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_688;
          bVar14 = toml::basic_value<toml::type_config>::contains(pbVar36,(key_type *)local_698);
          if (bVar14) {
            pvVar18 = toml::basic_value<toml::type_config>::at(pbVar36,(key_type *)local_698);
            fileops::tomlAsString_abi_cxx11_(&local_410,(fileops *)pvVar18,element_08);
          }
          else {
            local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
            local_410._M_string_length = 0;
            local_410.field_2._M_local_buf[0] = '\0';
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_688) {
            operator_delete((void *)local_698._0_8_,local_688._0_8_ + 1);
          }
          if (local_410._M_string_length != 0) {
            pCVar2 = ((callback_00.iface)->super_Interface).mCore;
            (*pCVar2->_vptr_Core[0x60])
                      (pCVar2,(ulong)(uint)((callback_00.iface)->super_Interface).handle.hid);
          }
          local_698._8_8_ = 0;
          local_688._8_8_ =
               std::
               _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1320:20)>
               ::_M_invoke;
          local_688._0_8_ =
               std::
               _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1320:20)>
               ::_M_manager;
          local_698._0_8_ = callback_00.iface;
          loadTags(pbVar36,(function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                            *)local_698);
          if ((code *)local_688._0_8_ != (code *)0x0) {
            (*(code *)local_688._0_8_)(local_698,local_698,3);
          }
          local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
          local_5c8.field_2._M_allocated_capacity._4_2_ = 0x6563;
          local_5c8.field_2._M_allocated_capacity._0_4_ = 0x72756f73;
          local_5c8._M_string_length = 6;
          local_5c8.field_2._M_local_buf[6] = '\0';
          local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
          local_4b0.field_2._M_allocated_capacity._0_4_ = 0x67726174;
          local_4b0._M_string_length = 7;
          local_4b0.field_2._M_allocated_capacity._4_4_ = 0x737465;
          local_5a8._0_8_ = local_598;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5a8,local_5c8._M_dataplus._M_p,
                     (undefined1 *)((long)&local_5c8.field_2 + 6));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,"_")
          ;
          pbVar22 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5a8,local_4b0._M_dataplus._M_p,local_4b0._M_string_length);
          local_698._0_8_ = (pbVar22->_M_dataplus)._M_p;
          paVar28 = &pbVar22->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ == paVar28) {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
            local_688._8_8_ = *(undefined8 *)((long)&pbVar22->field_2 + 8);
            local_698._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_688;
          }
          else {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
          }
          local_698._8_8_ = pbVar22->_M_string_length;
          (pbVar22->_M_dataplus)._M_p = (pointer)paVar28;
          pbVar22->_M_string_length = 0;
          (pbVar22->field_2)._M_local_buf[0] = '\0';
          bVar14 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Translator>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_4_>
                             (pbVar36,(string *)local_698,callback_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_688) {
            operator_delete((void *)local_698._0_8_,local_688._0_8_ + 1);
          }
          if ((undefined1 *)local_5a8._0_8_ != local_598) {
            operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
          }
          if (!bVar14) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_708,&local_5c8,&local_4b0);
            bVar14 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Translator>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_4_>
                               (pbVar36,(string *)local_708,callback_00);
            if ((Filter *)local_708._0_8_ != (Filter *)local_6f8) {
              operator_delete((void *)local_708._0_8_,(ulong)(local_6f8._0_8_ + 1));
            }
            _Var13._M_p = local_4b0._M_dataplus._M_p;
            if (!bVar14) {
              iVar17 = toupper((int)*local_4b0._M_dataplus._M_p);
              *_Var13._M_p = (char)iVar17;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6c0,&local_5c8,&local_4b0);
              addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Translator>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_4_>
                        (pbVar36,(string *)local_6c0,callback_00);
              if ((Filter *)local_6c0._0_8_ != (Filter *)(local_6c0 + 0x10)) {
                operator_delete((void *)local_6c0._0_8_,(ulong)(local_6c0._16_8_ + 1));
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
            operator_delete(local_4b0._M_dataplus._M_p,
                            CONCAT44(local_4b0.field_2._M_allocated_capacity._4_4_,
                                     local_4b0.field_2._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
            operator_delete(local_5c8._M_dataplus._M_p,
                            CONCAT17(local_5c8.field_2._M_local_buf[7],
                                     CONCAT16(local_5c8.field_2._M_local_buf[6],
                                              CONCAT24(local_5c8.field_2._M_allocated_capacity._4_2_
                                                       ,local_5c8.field_2._M_allocated_capacity.
                                                        _0_4_))) + 1);
          }
          local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
          local_5c8.field_2._M_allocated_capacity._0_4_ = 0x74736564;
          local_5c8.field_2._M_allocated_capacity._4_2_ = 0x6e69;
          local_5c8.field_2._M_local_buf[6] = 'a';
          local_5c8.field_2._7_4_ = 0x6e6f6974;
          local_5c8._M_string_length = 0xb;
          local_5c8.field_2._M_local_buf[0xb] = '\0';
          auStack_4f8._40_8_ = &local_4c0;
          local_4c0._M_allocated_capacity._0_4_ = 0x67726174;
          auStack_4f8._48_8_ = 7;
          local_4c0._M_allocated_capacity._4_4_ = 0x737465;
          local_5a8._0_8_ = local_598;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5a8,local_5c8._M_dataplus._M_p,
                     (undefined1 *)((long)&local_5c8.field_2 + 0xb));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,"_")
          ;
          pbVar22 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5a8,(char *)auStack_4f8._40_8_,auStack_4f8._48_8_);
          local_698._0_8_ = (pbVar22->_M_dataplus)._M_p;
          paVar28 = &pbVar22->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ == paVar28) {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
            local_688._8_8_ = *(undefined8 *)((long)&pbVar22->field_2 + 8);
            local_698._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_688;
          }
          else {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
          }
          local_698._8_8_ = pbVar22->_M_string_length;
          (pbVar22->_M_dataplus)._M_p = (pointer)paVar28;
          pbVar22->_M_string_length = 0;
          (pbVar22->field_2)._M_local_buf[0] = '\0';
          bVar14 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Translator>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_5_>
                             (pbVar36,(string *)local_698,callback_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_688) {
            operator_delete((void *)local_698._0_8_,local_688._0_8_ + 1);
          }
          if ((undefined1 *)local_5a8._0_8_ != local_598) {
            operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
          }
          if (!bVar14) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_708,&local_5c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (auStack_4f8 + 0x28));
            bVar14 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Translator>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_5_>
                               (pbVar36,(string *)local_708,callback_00);
            if ((Filter *)local_708._0_8_ != (Filter *)local_6f8) {
              operator_delete((void *)local_708._0_8_,(ulong)(local_6f8._0_8_ + 1));
            }
            uVar11 = auStack_4f8._40_8_;
            if (!bVar14) {
              iVar17 = toupper((int)*(char *)auStack_4f8._40_8_);
              *(char *)uVar11 = (char)iVar17;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6c0,&local_5c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (auStack_4f8 + 0x28));
              addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Translator>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_5_>
                        (pbVar36,(string *)local_6c0,callback_00);
              if ((Filter *)local_6c0._0_8_ != (Filter *)(local_6c0 + 0x10)) {
                operator_delete((void *)local_6c0._0_8_,(ulong)(local_6c0._16_8_ + 1));
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)auStack_4f8._40_8_ != &local_4c0) {
            operator_delete((void *)auStack_4f8._40_8_,
                            CONCAT44(local_4c0._M_allocated_capacity._4_4_,
                                     local_4c0._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
            operator_delete(local_5c8._M_dataplus._M_p,
                            CONCAT17(local_5c8.field_2._M_local_buf[7],
                                     CONCAT16(local_5c8.field_2._M_local_buf[6],
                                              CONCAT24(local_5c8.field_2._M_allocated_capacity._4_2_
                                                       ,local_5c8.field_2._M_allocated_capacity.
                                                        _0_4_))) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,
                            CONCAT71(local_410.field_2._M_allocated_capacity._1_7_,
                                     local_410.field_2._M_local_buf[0]) + 1);
          }
          local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_6f8 + 0x10),"source","");
          local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"endpoints","");
          local_5a8._0_8_ = local_598;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5a8,local_6e8._M_dataplus._M_p,
                     local_6e8._M_string_length + local_6e8._M_dataplus._M_p);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,"_")
          ;
          pbVar22 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5a8,local_340._M_dataplus._M_p,local_340._M_string_length);
          local_698._0_8_ = (pbVar22->_M_dataplus)._M_p;
          paVar28 = &pbVar22->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ == paVar28) {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
            local_688._8_8_ = *(undefined8 *)((long)&pbVar22->field_2 + 8);
            local_698._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_688;
          }
          else {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
          }
          local_698._8_8_ = pbVar22->_M_string_length;
          (pbVar22->_M_dataplus)._M_p = (pointer)paVar28;
          pbVar22->_M_string_length = 0;
          (pbVar22->field_2)._M_local_buf[0] = '\0';
          bVar14 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__6>
                             (pbVar36,(string *)local_698,(anon_class_8_1_36d583d8)callback_00.iface
                             );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_688) {
            operator_delete((void *)local_698._0_8_,local_688._0_8_ + 1);
          }
          if ((undefined1 *)local_5a8._0_8_ != local_598) {
            operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
          }
          if (!bVar14) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_708,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_6f8 + 0x10),&local_340);
            bVar14 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__6>
                               (pbVar36,(string *)local_708,
                                (anon_class_8_1_36d583d8)callback_00.iface);
            if ((Filter *)local_708._0_8_ != (Filter *)local_6f8) {
              operator_delete((void *)local_708._0_8_,(ulong)(local_6f8._0_8_ + 1));
            }
            _Var13._M_p = local_340._M_dataplus._M_p;
            if (!bVar14) {
              iVar17 = toupper((int)*local_340._M_dataplus._M_p);
              *_Var13._M_p = (char)iVar17;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6c0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_6f8 + 0x10),&local_340);
              addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__6>
                        (pbVar36,(string *)local_6c0,(anon_class_8_1_36d583d8)callback_00.iface);
              if ((Filter *)local_6c0._0_8_ != (Filter *)(local_6c0 + 0x10)) {
                operator_delete((void *)local_6c0._0_8_,(ulong)(local_6c0._16_8_ + 1));
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != &local_340.field_2) {
            operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
            operator_delete(local_6e8._M_dataplus._M_p,
                            CONCAT26(local_6e8.field_2._M_allocated_capacity._6_2_,
                                     CONCAT15(local_6e8.field_2._M_local_buf[5],
                                              CONCAT14(local_6e8.field_2._M_local_buf[4],
                                                       local_6e8.field_2._M_allocated_capacity._0_4_
                                                      ))) + 1);
          }
          local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_6f8 + 0x10),"destination","");
          local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"endpoints","");
          local_5a8._0_8_ = local_598;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5a8,local_6e8._M_dataplus._M_p,
                     local_6e8._M_string_length + local_6e8._M_dataplus._M_p);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,"_")
          ;
          pbVar22 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5a8,local_360._M_dataplus._M_p,local_360._M_string_length);
          local_698._0_8_ = (pbVar22->_M_dataplus)._M_p;
          paVar28 = &pbVar22->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ == paVar28) {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
            local_688._8_8_ = *(undefined8 *)((long)&pbVar22->field_2 + 8);
            local_698._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_688;
          }
          else {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
          }
          local_698._8_8_ = pbVar22->_M_string_length;
          (pbVar22->_M_dataplus)._M_p = (pointer)paVar28;
          pbVar22->_M_string_length = 0;
          (pbVar22->field_2)._M_local_buf[0] = '\0';
          bVar14 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__7>
                             (pbVar36,(string *)local_698,(anon_class_8_1_36d583d8)callback_00.iface
                             );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_688) {
            operator_delete((void *)local_698._0_8_,local_688._0_8_ + 1);
          }
          if ((undefined1 *)local_5a8._0_8_ != local_598) {
            operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
          }
          if (!bVar14) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_708,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_6f8 + 0x10),&local_360);
            bVar14 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__7>
                               (pbVar36,(string *)local_708,
                                (anon_class_8_1_36d583d8)callback_00.iface);
            if ((Filter *)local_708._0_8_ != (Filter *)local_6f8) {
              operator_delete((void *)local_708._0_8_,(ulong)(local_6f8._0_8_ + 1));
            }
            _Var13._M_p = local_360._M_dataplus._M_p;
            if (!bVar14) {
              iVar17 = toupper((int)*local_360._M_dataplus._M_p);
              *_Var13._M_p = (char)iVar17;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6c0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_6f8 + 0x10),&local_360);
              addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__7>
                        (pbVar36,(string *)local_6c0,(anon_class_8_1_36d583d8)callback_00.iface);
              if ((Filter *)local_6c0._0_8_ != (Filter *)(local_6c0 + 0x10)) {
                operator_delete((void *)local_6c0._0_8_,(ulong)(local_6c0._16_8_ + 1));
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_dataplus._M_p != &local_360.field_2) {
            operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
            operator_delete(local_6e8._M_dataplus._M_p,
                            CONCAT26(local_6e8.field_2._M_allocated_capacity._6_2_,
                                     CONCAT15(local_6e8.field_2._M_local_buf[5],
                                              CONCAT14(local_6e8.field_2._M_local_buf[4],
                                                       local_6e8.field_2._M_allocated_capacity._0_4_
                                                      ))) + 1);
          }
          local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_6f8 + 0x10),"source","");
          local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"publications","");
          local_5a8._0_8_ = local_598;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5a8,local_6e8._M_dataplus._M_p,
                     local_6e8._M_string_length + local_6e8._M_dataplus._M_p);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,"_")
          ;
          pbVar22 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5a8,local_380._M_dataplus._M_p,local_380._M_string_length);
          local_698._0_8_ = (pbVar22->_M_dataplus)._M_p;
          paVar28 = &pbVar22->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ == paVar28) {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
            local_688._8_8_ = *(undefined8 *)((long)&pbVar22->field_2 + 8);
            local_698._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_688;
          }
          else {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
          }
          local_698._8_8_ = pbVar22->_M_string_length;
          (pbVar22->_M_dataplus)._M_p = (pointer)paVar28;
          pbVar22->_M_string_length = 0;
          (pbVar22->field_2)._M_local_buf[0] = '\0';
          bVar14 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__8>
                             (pbVar36,(string *)local_698,(anon_class_8_1_36d583d8)callback_00.iface
                             );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_688) {
            operator_delete((void *)local_698._0_8_,local_688._0_8_ + 1);
          }
          if ((undefined1 *)local_5a8._0_8_ != local_598) {
            operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
          }
          if (!bVar14) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_708,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_6f8 + 0x10),&local_380);
            bVar14 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__8>
                               (pbVar36,(string *)local_708,
                                (anon_class_8_1_36d583d8)callback_00.iface);
            if ((Filter *)local_708._0_8_ != (Filter *)local_6f8) {
              operator_delete((void *)local_708._0_8_,(ulong)(local_6f8._0_8_ + 1));
            }
            _Var13._M_p = local_380._M_dataplus._M_p;
            if (!bVar14) {
              iVar17 = toupper((int)*local_380._M_dataplus._M_p);
              *_Var13._M_p = (char)iVar17;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6c0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_6f8 + 0x10),&local_380);
              addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__8>
                        (pbVar36,(string *)local_6c0,(anon_class_8_1_36d583d8)callback_00.iface);
              if ((Filter *)local_6c0._0_8_ != (Filter *)(local_6c0 + 0x10)) {
                operator_delete((void *)local_6c0._0_8_,(ulong)(local_6c0._16_8_ + 1));
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._M_dataplus._M_p != &local_380.field_2) {
            operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
            operator_delete(local_6e8._M_dataplus._M_p,
                            CONCAT26(local_6e8.field_2._M_allocated_capacity._6_2_,
                                     CONCAT15(local_6e8.field_2._M_local_buf[5],
                                              CONCAT14(local_6e8.field_2._M_local_buf[4],
                                                       local_6e8.field_2._M_allocated_capacity._0_4_
                                                      ))) + 1);
          }
          local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_6f8 + 0x10),"destination","");
          local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"inputs","");
          local_5a8._0_8_ = local_598;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5a8,local_6e8._M_dataplus._M_p,
                     local_6e8._M_string_length + local_6e8._M_dataplus._M_p);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,"_")
          ;
          pbVar22 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5a8,local_3a0._M_dataplus._M_p,local_3a0._M_string_length);
          local_698._0_8_ = (pbVar22->_M_dataplus)._M_p;
          paVar28 = &pbVar22->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ == paVar28) {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
            local_688._8_8_ = *(undefined8 *)((long)&pbVar22->field_2 + 8);
            local_698._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_688;
          }
          else {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
          }
          local_698._8_8_ = pbVar22->_M_string_length;
          (pbVar22->_M_dataplus)._M_p = (pointer)paVar28;
          pbVar22->_M_string_length = 0;
          (pbVar22->field_2)._M_local_buf[0] = '\0';
          bVar14 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__9>
                             (pbVar36,(string *)local_698,(anon_class_8_1_36d583d8)callback_00.iface
                             );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_688) {
            operator_delete((void *)local_698._0_8_,local_688._0_8_ + 1);
          }
          if ((undefined1 *)local_5a8._0_8_ != local_598) {
            operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
          }
          if (!bVar14) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_708,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_6f8 + 0x10),&local_3a0);
            bVar14 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__9>
                               (pbVar36,(string *)local_708,
                                (anon_class_8_1_36d583d8)callback_00.iface);
            if ((Filter *)local_708._0_8_ != (Filter *)local_6f8) {
              operator_delete((void *)local_708._0_8_,(ulong)(local_6f8._0_8_ + 1));
            }
            _Var13._M_p = local_3a0._M_dataplus._M_p;
            if (!bVar14) {
              iVar17 = toupper((int)*local_3a0._M_dataplus._M_p);
              *_Var13._M_p = (char)iVar17;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6c0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_6f8 + 0x10),&local_3a0);
              addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__9>
                        (pbVar36,(string *)local_6c0,(anon_class_8_1_36d583d8)callback_00.iface);
              if ((Filter *)local_6c0._0_8_ != (Filter *)(local_6c0 + 0x10)) {
                operator_delete((void *)local_6c0._0_8_,(ulong)(local_6c0._16_8_ + 1));
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
            operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
            operator_delete(local_6e8._M_dataplus._M_p,
                            CONCAT26(local_6e8.field_2._M_allocated_capacity._6_2_,
                                     CONCAT15(local_6e8.field_2._M_local_buf[5],
                                              CONCAT14(local_6e8.field_2._M_local_buf[4],
                                                       local_6e8.field_2._M_allocated_capacity._0_4_
                                                      ))) + 1);
          }
          local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_6f8 + 0x10),"source","");
          local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"filters","");
          local_5a8._0_8_ = local_598;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5a8,local_6e8._M_dataplus._M_p,
                     local_6e8._M_string_length + local_6e8._M_dataplus._M_p);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,"_")
          ;
          pbVar22 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5a8,local_3c0._M_dataplus._M_p,local_3c0._M_string_length);
          local_698._0_8_ = (pbVar22->_M_dataplus)._M_p;
          paVar28 = &pbVar22->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ == paVar28) {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
            local_688._8_8_ = *(undefined8 *)((long)&pbVar22->field_2 + 8);
            local_698._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_688;
          }
          else {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
          }
          local_698._8_8_ = pbVar22->_M_string_length;
          (pbVar22->_M_dataplus)._M_p = (pointer)paVar28;
          pbVar22->_M_string_length = 0;
          (pbVar22->field_2)._M_local_buf[0] = '\0';
          bVar14 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__10>
                             (pbVar36,(string *)local_698,(anon_class_8_1_36d583d8)callback_00.iface
                             );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_688) {
            operator_delete((void *)local_698._0_8_,local_688._0_8_ + 1);
          }
          if ((undefined1 *)local_5a8._0_8_ != local_598) {
            operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
          }
          if (!bVar14) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_708,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_6f8 + 0x10),&local_3c0);
            bVar14 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__10>
                               (pbVar36,(string *)local_708,
                                (anon_class_8_1_36d583d8)callback_00.iface);
            if ((Filter *)local_708._0_8_ != (Filter *)local_6f8) {
              operator_delete((void *)local_708._0_8_,(ulong)(local_6f8._0_8_ + 1));
            }
            _Var13._M_p = local_3c0._M_dataplus._M_p;
            if (!bVar14) {
              iVar17 = toupper((int)*local_3c0._M_dataplus._M_p);
              *_Var13._M_p = (char)iVar17;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6c0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_6f8 + 0x10),&local_3c0);
              addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__10>
                        (pbVar36,(string *)local_6c0,(anon_class_8_1_36d583d8)callback_00.iface);
              if ((Filter *)local_6c0._0_8_ != (Filter *)(local_6c0 + 0x10)) {
                operator_delete((void *)local_6c0._0_8_,(ulong)(local_6c0._16_8_ + 1));
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
            operator_delete(local_6e8._M_dataplus._M_p,
                            CONCAT26(local_6e8.field_2._M_allocated_capacity._6_2_,
                                     CONCAT15(local_6e8.field_2._M_local_buf[5],
                                              CONCAT14(local_6e8.field_2._M_local_buf[4],
                                                       local_6e8.field_2._M_allocated_capacity._0_4_
                                                      ))) + 1);
          }
          local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_6f8 + 0x10),"destination","");
          local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"filters","");
          local_5a8._0_8_ = local_598;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5a8,local_6e8._M_dataplus._M_p,
                     local_6e8._M_string_length + local_6e8._M_dataplus._M_p);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,"_")
          ;
          pbVar22 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5a8,local_3e0._M_dataplus._M_p,local_3e0._M_string_length);
          local_698._0_8_ = (pbVar22->_M_dataplus)._M_p;
          paVar28 = &pbVar22->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ == paVar28) {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
            local_688._8_8_ = *(undefined8 *)((long)&pbVar22->field_2 + 8);
            local_698._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_688;
          }
          else {
            local_688._0_8_ = paVar28->_M_allocated_capacity;
          }
          local_698._8_8_ = pbVar22->_M_string_length;
          (pbVar22->_M_dataplus)._M_p = (pointer)paVar28;
          pbVar22->_M_string_length = 0;
          (pbVar22->field_2)._M_local_buf[0] = '\0';
          bVar14 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__11>
                             (pbVar36,(string *)local_698,(anon_class_8_1_36d583d8)callback_00.iface
                             );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_688) {
            operator_delete((void *)local_698._0_8_,local_688._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_598) {
            operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
          }
          if (!bVar14) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_708,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_6f8 + 0x10),&local_3e0);
            bVar14 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__11>
                               (pbVar36,(string *)local_708,
                                (anon_class_8_1_36d583d8)callback_00.iface);
            if ((Filter *)local_708._0_8_ != (Filter *)local_6f8) {
              operator_delete((void *)local_708._0_8_,(ulong)(local_6f8._0_8_ + 1));
            }
            _Var13._M_p = local_3e0._M_dataplus._M_p;
            if (!bVar14) {
              iVar17 = toupper((int)*local_3e0._M_dataplus._M_p);
              *_Var13._M_p = (char)iVar17;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6c0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_6f8 + 0x10),&local_3e0);
              addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__11>
                        (pbVar36,(string *)local_6c0,(anon_class_8_1_36d583d8)callback_00.iface);
              if ((Filter *)local_6c0._0_8_ != (Filter *)(local_6c0 + 0x10)) {
                operator_delete((void *)local_6c0._0_8_,(ulong)(local_6c0._16_8_ + 1));
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
            operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
            operator_delete(local_6e8._M_dataplus._M_p,
                            CONCAT26(local_6e8.field_2._M_allocated_capacity._6_2_,
                                     CONCAT15(local_6e8.field_2._M_local_buf[5],
                                              CONCAT14(local_6e8.field_2._M_local_buf[4],
                                                       local_6e8.field_2._M_allocated_capacity._0_4_
                                                      ))) + 1);
          }
          bVar14 = *(bool *)((long)local_6a0 + 10);
          local_688._0_8_ = (code *)0x69747265706f7270;
          local_698._8_8_ = 10;
          local_688._8_3_ = 0x7365;
          local_698._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_688;
          bVar16 = fileops::isMember(pbVar36,(string *)local_698);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_688) {
            operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
          }
          if (bVar16) {
            local_688._0_8_ = (code *)0x69747265706f7270;
            local_698._8_8_ = 10;
            local_688._8_3_ = 0x7365;
            local_698._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_688;
            pvVar18 = toml::basic_value<toml::type_config>::at(pbVar36,(key_type *)local_698);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_698._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_688) {
              operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
            }
            if (pvVar18->type_ == array) {
              paVar19 = toml::basic_value<toml::type_config>::as_array(pvVar18);
              pbVar3 = (paVar19->
                       super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              for (pbVar31 = (paVar19->
                             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                             )._M_impl.super__Vector_impl_data._M_start; pbVar31 != pbVar3;
                  pbVar31 = pbVar31 + 1) {
                local_5a8._0_8_ = local_598;
                local_5a8._8_8_ = (EVP_PKEY_CTX *)0x0;
                local_598._0_8_ = local_598._0_8_ & 0xffffffffffffff00;
                pbVar24 = toml::find_or<std::__cxx11::string,toml::type_config,char[5]>
                                    (pbVar31,(char (*) [5])0x43fbf7,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_5a8);
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::_M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_5a8,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            pbVar24);
                toml::basic_value<toml::type_config>::basic_value
                          ((basic_value<toml::type_config> *)local_698);
                peVar21 = toml::find_or<toml::type_config,char[6]>
                                    (pbVar31,(char (*) [6])0x4210ea,
                                     (basic_value<toml::type_config> *)local_698);
                pEVar32 = (EVP_PKEY_CTX *)local_5a8._8_8_;
                uVar11 = local_5a8._0_8_;
                if ((EVP_PKEY_CTX *)local_5a8._8_8_ == (EVP_PKEY_CTX *)0x0) {
LAB_00240988:
                  if (bVar14 != false) {
                    message_12._M_str = "interface properties require \"name\" and \"value\" fields"
                    ;
                    message_12._M_len = 0x36;
                    logMessage((Federate *)local_6a0,0,message_12);
                    pHVar27 = (HelicsException *)__cxa_allocate_exception(0x28);
                    message_00._M_str = "interface properties require \"name\" and \"value\" fields"
                    ;
                    message_00._M_len = 0x36;
                    HelicsException::HelicsException(pHVar27,message_00);
                    *(undefined ***)pHVar27 = &PTR__HelicsException_0054b1d8;
                    __cxa_throw(pHVar27,&InvalidParameter::typeinfo,
                                HelicsException::~HelicsException);
                  }
                  pEVar32 = (EVP_PKEY_CTX *)0x3;
                  message_09._M_str = "interface properties require \"name\" and \"value\" fields";
                  message_09._M_len = 0x36;
                  logMessage((Federate *)local_6a0,3,message_09);
                }
                else if (peVar21->type_ == floating) {
                  pfVar25 = toml::basic_value<toml::type_config>::as_floating(peVar21);
                  (*((callback_00.iface)->super_Interface)._vptr_Interface[5])
                            (SUB84(*pfVar25,0),callback_00.iface,pEVar32,uVar11);
                }
                else {
                  if (peVar21->type_ == empty) goto LAB_00240988;
                  psVar23 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(peVar21);
                  (*((callback_00.iface)->super_Interface)._vptr_Interface[6])
                            (callback_00.iface,pEVar32,uVar11,psVar23->_M_string_length,
                             (psVar23->_M_dataplus)._M_p);
                }
                toml::basic_value<toml::type_config>::cleanup
                          ((basic_value<toml::type_config> *)local_698,pEVar32);
                CLI::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_4f8._32_8_);
                toml::detail::region::~region(&local_650);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5a8._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_598) {
                  operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
                }
              }
            }
            else {
              local_5a8._0_8_ = local_598;
              local_5a8._8_8_ = (EVP_PKEY_CTX *)0x0;
              local_598._0_8_ = local_598._0_8_ & 0xffffffffffffff00;
              pbVar24 = toml::find_or<std::__cxx11::string,toml::type_config,char[5]>
                                  (pvVar18,(char (*) [5])0x43fbf7,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_5a8);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_5a8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar24
                       );
              toml::basic_value<toml::type_config>::basic_value
                        ((basic_value<toml::type_config> *)local_698);
              peVar21 = toml::find_or<toml::type_config,char[6]>
                                  (pvVar18,(char (*) [6])0x4210ea,
                                   (basic_value<toml::type_config> *)local_698);
              pEVar32 = (EVP_PKEY_CTX *)local_5a8._8_8_;
              uVar11 = local_5a8._0_8_;
              if ((EVP_PKEY_CTX *)local_5a8._8_8_ == (EVP_PKEY_CTX *)0x0) {
LAB_00240ae5:
                if (bVar14 != false) {
                  message_15._M_str = "interface properties require \"name\" and \"value\" fields";
                  message_15._M_len = 0x36;
                  logMessage((Federate *)local_6a0,0,message_15);
                  pHVar27 = (HelicsException *)__cxa_allocate_exception(0x28);
                  message_03._M_str = "interface properties require \"name\" and \"value\" fields";
                  message_03._M_len = 0x36;
                  HelicsException::HelicsException(pHVar27,message_03);
                  *(undefined ***)pHVar27 = &PTR__HelicsException_0054b1d8;
                  __cxa_throw(pHVar27,&InvalidParameter::typeinfo,HelicsException::~HelicsException)
                  ;
                }
                pEVar32 = (EVP_PKEY_CTX *)0x3;
                message_10._M_str = "interface properties require \"name\" and \"value\" fields";
                message_10._M_len = 0x36;
                logMessage((Federate *)local_6a0,3,message_10);
              }
              else if (peVar21->type_ == floating) {
                pfVar25 = toml::basic_value<toml::type_config>::as_floating(peVar21);
                (*((callback_00.iface)->super_Interface)._vptr_Interface[5])
                          (SUB84(*pfVar25,0),callback_00.iface,pEVar32,uVar11);
              }
              else {
                if (peVar21->type_ == empty) goto LAB_00240ae5;
                psVar23 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(peVar21);
                (*((callback_00.iface)->super_Interface)._vptr_Interface[6])
                          (callback_00.iface,pEVar32,uVar11,psVar23->_M_string_length,
                           (psVar23->_M_dataplus)._M_p);
              }
              toml::basic_value<toml::type_config>::cleanup
                        ((basic_value<toml::type_config> *)local_698,pEVar32);
              CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_4f8._32_8_);
              toml::detail::region::~region(&local_650);
              pcVar33 = (code *)local_598._0_8_;
              paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_5a8._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_598) goto LAB_0023f184;
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470._M_dataplus._M_p != &local_470.field_2) {
          operator_delete(local_470._M_dataplus._M_p,
                          CONCAT71(local_470.field_2._M_allocated_capacity._1_7_,
                                   local_470.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != &local_450.field_2) {
          operator_delete(local_450._M_dataplus._M_p,
                          CONCAT71(local_450.field_2._M_allocated_capacity._1_7_,
                                   local_450.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_490._M_allocated_capacity != &local_480) {
          operator_delete((void *)local_490._M_allocated_capacity,
                          CONCAT71(local_480._M_allocated_capacity._1_7_,local_480._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != &local_430.field_2) {
          operator_delete(local_430._M_dataplus._M_p,
                          CONCAT71(local_430.field_2._M_allocated_capacity._1_7_,
                                   local_430.field_2._M_local_buf[0]) + 1);
        }
        pbVar36 = pbVar36 + 1;
      } while (pbVar36 != local_3f0);
    }
  }
  local_698._0_8_ = local_688;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"globals","");
  bVar14 = fileops::isMember(&local_288,(string *)local_698);
  if ((undefined1 *)local_698._0_8_ != local_688) {
    operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
  }
  if (bVar14) {
    local_698._0_8_ = local_688;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"globals","");
    pvVar18 = toml::basic_value<toml::type_config>::at(&local_288,(key_type *)local_698);
    if ((undefined1 *)local_698._0_8_ != local_688) {
      operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
    }
    if (pvVar18->type_ == array) {
      paVar19 = toml::basic_value<toml::type_config>::as_array(pvVar18);
      pbVar3 = (paVar19->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar31 = (paVar19->
                     super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar31 != pbVar3;
          pbVar31 = pbVar31 + 1) {
        paVar19 = toml::basic_value<toml::type_config>::as_array(pbVar31);
        psVar23 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                            ((paVar19->
                             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
        pcVar4 = (psVar23->_M_dataplus)._M_p;
        sVar5 = psVar23->_M_string_length;
        paVar19 = toml::basic_value<toml::type_config>::as_array(pbVar31);
        psVar23 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                            ((paVar19->
                             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1);
        peVar6 = (((shared_ptr<helics::Core> *)((long)local_6a0 + 0x18))->
                 super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        (*peVar6->_vptr_Core[0x5a])
                  (peVar6,sVar5,pcVar4,psVar23->_M_string_length,(psVar23->_M_dataplus)._M_p);
      }
    }
    else {
      ptVar26 = toml::basic_value<toml::type_config>::as_table_abi_cxx11_(pvVar18);
      p_Var30 = &(ptVar26->_M_h)._M_before_begin;
      while (p_Var30 = p_Var30->_M_nxt, p_Var30 != (__node_base *)0x0) {
        _Var7._M_nxt = p_Var30[1]._M_nxt;
        p_Var8 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var30 + 2))->_M_max_load_factor;
        psVar23 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                            ((basic_value<toml::type_config> *)(p_Var30 + 5));
        peVar6 = (((shared_ptr<helics::Core> *)((long)local_6a0 + 0x18))->
                 super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        (*peVar6->_vptr_Core[0x5a])
                  (peVar6,p_Var8,_Var7._M_nxt,psVar23->_M_string_length,(psVar23->_M_dataplus)._M_p)
        ;
      }
    }
  }
  toml::basic_value<toml::type_config>::basic_value(&local_f8,&local_288);
  local_698._0_8_ = local_688;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"globals","");
  local_5a8._8_8_ = 0;
  local_5a8._0_8_ = local_6a0;
  local_598._8_8_ =
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1785:38)>
       ::_M_invoke;
  local_598._0_8_ =
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1785:38)>
       ::_M_manager;
  psVar34 = (string *)local_698;
  arrayPairProcess(&local_f8,psVar34,
                   (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)local_5a8);
  if ((code *)local_598._0_8_ != (code *)0x0) {
    psVar34 = (string *)local_5a8;
    (*(code *)local_598._0_8_)(psVar34,psVar34,3);
  }
  if ((undefined1 *)local_698._0_8_ != local_688) {
    psVar34 = (string *)(local_688._0_8_ + 1);
    operator_delete((void *)local_698._0_8_,(ulong)psVar34);
  }
  toml::basic_value<toml::type_config>::cleanup(&local_f8,(EVP_PKEY_CTX *)psVar34);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_f8.comments_);
  toml::detail::region::~region(&local_f8.region_);
  toml::basic_value<toml::type_config>::basic_value(&local_1c0,&local_288);
  local_698._0_8_ = local_688;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"aliases","");
  local_5a8._8_8_ = 0;
  local_5a8._0_8_ = local_6a0;
  local_598._8_8_ =
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1788:38)>
       ::_M_invoke;
  local_598._0_8_ =
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1788:38)>
       ::_M_manager;
  psVar34 = (string *)local_698;
  arrayPairProcess(&local_1c0,psVar34,
                   (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)local_5a8);
  if ((code *)local_598._0_8_ != (code *)0x0) {
    psVar34 = (string *)local_5a8;
    (*(code *)local_598._0_8_)(psVar34,psVar34,3);
  }
  if ((undefined1 *)local_698._0_8_ != local_688) {
    psVar34 = (string *)(local_688._0_8_ + 1);
    operator_delete((void *)local_698._0_8_,(ulong)psVar34);
  }
  toml::basic_value<toml::type_config>::cleanup(&local_1c0,(EVP_PKEY_CTX *)psVar34);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1c0.comments_);
  toml::detail::region::~region(&local_1c0.region_);
  tagAction = (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)local_698;
  local_698._8_8_ = 0;
  local_698._0_8_ = local_6a0;
  local_688._8_8_ =
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1792:19)>
       ::_M_invoke;
  local_688._0_8_ =
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1792:19)>
       ::_M_manager;
  loadTags(&local_288,tagAction);
  if ((code *)local_688._0_8_ != (code *)0x0) {
    tagAction = (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                 *)local_698;
    (*(code *)local_688._0_8_)(tagAction,tagAction,3);
  }
  toml::basic_value<toml::type_config>::cleanup(&local_288,(EVP_PKEY_CTX *)tagAction);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_288.comments_);
  toml::detail::region::~region(&local_288.region_);
  return;
}

Assistant:

void Federate::registerConnectorInterfacesToml(const std::string& tomlString)
{
    using fileops::getOrDefault;
    using fileops::isMember;
    using fileops::replaceIfMember;

    toml::value doc;
    try {
        doc = fileops::loadToml(tomlString);
    }
    catch (const std::invalid_argument& ia) {
        throw(helics::InvalidParameter(ia.what()));
    }
    bool defaultGlobal = false;
    replaceIfMember(doc, "defaultglobal", defaultGlobal);

    if (isMember(doc, "filters")) {
        auto& filts = toml::find(doc, "filters");
        if (!filts.is_array()) {
            throw(helics::InvalidParameter("filters section in toml file must be an array"));
        }
        auto& filtArray = filts.as_array();
        for (const auto& filt : filtArray) {
            const std::string key = getOrDefault(filt, "name", emptyStr);
            const bool cloningflag = getOrDefault(filt, "cloning", false);
            const std::string inputType = getOrDefault(filt, "inputType", emptyStr);
            const std::string outputType = getOrDefault(filt, "outputType", emptyStr);
            const bool useTypes = !((inputType.empty()) && (outputType.empty()));
            const bool global = getOrDefault(filt, "global", defaultGlobal);
            const std::string operation = getOrDefault(filt, "operation", std::string("custom"));

            auto opType = filterTypeFromString(operation);
            if (!checkValidFilterType(useTypes, opType, operation)) {
                continue;
            }
            auto& filter =
                generateFilter(this, global, cloningflag, key, opType, inputType, outputType);

            loadOptions(this, filt, filter);
            addTargetVariations(filt, "source", "endpoints", [&filter](const std::string& target) {
                filter.addSourceTarget(target);
            });
            addTargetVariations(filt,
                                "destination",
                                "endpoints",
                                [&filter](const std::string& target) {
                                    filter.addDestinationTarget(target);
                                });
            if (cloningflag) {
                addTargets(filt, "delivery", [&filter](const std::string& target) {
                    static_cast<CloningFilter&>(filter).addDeliveryEndpoint(target);
                });
            }
            loadPropertiesToml(this, filter, filt, strictConfigChecking);
        }
    }
    if (isMember(doc, "translators")) {
        auto& transs = toml::find(doc, "translators");
        if (!transs.is_array()) {
            throw(helics::InvalidParameter("translators section in toml file must be an array"));
        }
        auto& transArray = transs.as_array();
        for (const auto& trans : transArray) {
            const std::string key = getOrDefault(trans, "name", emptyStr);

            std::string ttype = getOrDefault(trans, "type", std::string("custom"));
            auto opType = translatorTypeFromString(ttype);
            auto etype = fileops::getOrDefault(trans, "endpointtype", emptyStr);
            auto units = fileops::getOrDefault(trans, "unit", emptyStr);
            fileops::replaceIfMember(trans, "units", units);
            const bool global = fileops::getOrDefault(trans, "global", defaultGlobal);

            if (opType == TranslatorTypes::UNRECOGNIZED) {
                if (strictConfigChecking) {
                    const std::string emessage =
                        fmt::format("unrecognized translator type:{}", ttype);
                    logMessage(HELICS_LOG_LEVEL_ERROR, emessage);

                    throw(InvalidParameter(emessage));
                }
                logMessage(HELICS_LOG_LEVEL_WARNING,
                           fmt::format("unrecognized filter operation:{}", ttype));
                continue;
            }
            auto& translator = generateTranslator(this, global, key, opType, etype, units);
            loadOptions(this, trans, translator);

            addTargetVariations(trans,
                                "source",
                                "endpoints",
                                [&translator](const std::string& target) {
                                    translator.addSourceEndpoint(target);
                                });
            addTargetVariations(trans,
                                "destination",
                                "endpoints",
                                [&translator](const std::string& target) {
                                    translator.addDestinationEndpoint(target);
                                });
            addTargetVariations(trans,
                                "source",
                                "publications",
                                [&translator](const std::string& target) {
                                    translator.addPublication(target);
                                });
            addTargetVariations(trans,
                                "destination",
                                "inputs",
                                [&translator](const std::string& target) {
                                    translator.addInputTarget(target);
                                });
            addTargetVariations(trans,
                                "source",
                                "filters",
                                [&translator](const std::string& target) {
                                    translator.addSourceFilter(target);
                                });
            addTargetVariations(trans,
                                "destination",
                                "filters",
                                [&translator](const std::string& target) {
                                    translator.addDestinationFilter(target);
                                });
            loadPropertiesToml(this, translator, trans, strictConfigChecking);
        }
    }
    if (isMember(doc, "globals")) {
        auto& globals = toml::find(doc, "globals");
        if (globals.is_array()) {
            for (auto& val : globals.as_array()) {
                setGlobal(static_cast<std::string_view>(val.as_array()[0].as_string()),
                          static_cast<std::string_view>(val.as_array()[1].as_string()));
            }
        } else {
            for (const auto& val : globals.as_table()) {
                setGlobal(val.first, static_cast<std::string_view>(val.second.as_string()));
            }
        }
    }

    arrayPairProcess(doc, "globals", [this](std::string_view key, std::string_view val) {
        setGlobal(key, val);
    });
    arrayPairProcess(doc, "aliases", [this](std::string_view key, std::string_view val) {
        addAlias(key, val);
    });

    loadTags(doc, [this](std::string_view tagname, std::string_view tagvalue) {
        this->setTag(tagname, tagvalue);
    });
}